

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O2

Signal<double,_int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getPtr(SignalPtr<double,_int> *this)

{
  int iVar1;
  ExceptionSignal *this_00;
  allocator<char> local_3d;
  ErrorCodeEnum local_3c;
  string local_38 [32];
  
  iVar1 = (*this->_vptr_SignalPtr[4])();
  if ((char)iVar1 != '\0') {
    return this->signalPtr;
  }
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_3c = NOT_INITIALIZED;
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"In SignalPtr: SIN ptr not set.",&local_3d);
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_3c,local_38," (in signal <%s>)",
             *(undefined8 *)((long)&this->signalPtr + (long)this->_vptr_SignalPtr[-3]));
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

const Signal<T, Time> *SignalPtr<T, Time>::getPtr() const {
  dgTDEBUGIN(25) << SignalBase<Time>::name << "(" << isPlugged() << ")" << this
                 << "->" << signalPtr << std::endl;
  dgTDEBUGIN(25);
  if (!isPlugged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  dgTDEBUGOUT(25);
  return signalPtr;
}